

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O0

void IntraChromaPreds_C(uint8_t *dst,uint8_t *left,uint8_t *top)

{
  long lVar1;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  int size;
  
  DCMode(dst,left,top,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20));
  VerticalPred(in_RSI,in_RDX,0);
  HorizontalPred(in_RSI,in_RDX,0);
  TrueMotion(dst,left,top,(int)((ulong)in_RDI >> 0x20));
  lVar1 = in_RDI + 8;
  if (in_RDX != (uint8_t *)0x0) {
    in_RDX = in_RDX + 8;
  }
  if (in_RSI != (uint8_t *)0x0) {
    in_RSI = in_RSI + 0x10;
  }
  DCMode(dst,left,top,(int)((ulong)lVar1 >> 0x20),(int)lVar1,(int)((ulong)in_RSI >> 0x20));
  size = (int)((ulong)lVar1 >> 0x20);
  VerticalPred(in_RSI,in_RDX,0);
  HorizontalPred(in_RSI,in_RDX,0);
  TrueMotion(dst,left,top,size);
  return;
}

Assistant:

static void IntraChromaPreds_C(uint8_t* WEBP_RESTRICT dst,
                               const uint8_t* WEBP_RESTRICT left,
                               const uint8_t* WEBP_RESTRICT top) {
  // U block
  DCMode(C8DC8 + dst, left, top, 8, 8, 4);
  VerticalPred(C8VE8 + dst, top, 8);
  HorizontalPred(C8HE8 + dst, left, 8);
  TrueMotion(C8TM8 + dst, left, top, 8);
  // V block
  dst += 8;
  if (top != NULL) top += 8;
  if (left != NULL) left += 16;
  DCMode(C8DC8 + dst, left, top, 8, 8, 4);
  VerticalPred(C8VE8 + dst, top, 8);
  HorizontalPred(C8HE8 + dst, left, 8);
  TrueMotion(C8TM8 + dst, left, top, 8);
}